

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pbuilder_pbx.cpp
# Opt level: O1

QString * quotedStringLiteral(QString *__return_storage_ptr__,QString *value)

{
  ArrayOptions *pAVar1;
  char16_t cVar2;
  Data *pDVar3;
  long lVar4;
  long lVar5;
  QChar QVar6;
  ulong uVar7;
  uint uVar8;
  long in_FS_OFFSET;
  QLatin1String QVar9;
  QArrayData *local_90 [3];
  QArrayData *local_78;
  char16_t *pcStack_70;
  qsizetype local_68;
  QStringBuilder<QLatin1String,_QString> local_60;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = 0;
  uVar8 = (uint)(value->d).size;
  lVar5 = (long)((int)((double)(int)uVar8 * 1.1) + 2);
  pDVar3 = (__return_storage_ptr__->d).d;
  if (((pDVar3 == (Data *)0x0) ||
      (1 < (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) ||
     ((pDVar3->super_QArrayData).alloc -
      ((long)((long)(__return_storage_ptr__->d).ptr -
             ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 1) <=
      lVar5)) {
    lVar4 = (__return_storage_ptr__->d).size;
    if (lVar5 < lVar4) {
      lVar5 = lVar4;
    }
    QString::reallocData((longlong)__return_storage_ptr__,(AllocationOption)lVar5);
  }
  pDVar3 = (__return_storage_ptr__->d).d;
  if ((pDVar3 != (Data *)0x0) && ((pDVar3->super_QArrayData).alloc != 0)) {
    pAVar1 = &(pDVar3->super_QArrayData).flags;
    *(byte *)&(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
              super_QFlagsStorage<QArrayData::ArrayOption>.i =
         (byte)(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
               super_QFlagsStorage<QArrayData::ArrayOption>.i | 1;
  }
  QVar6.ucs = (char16_t)__return_storage_ptr__;
  QString::append(QVar6);
  if (0 < (int)uVar8) {
    uVar7 = 0;
    do {
      cVar2 = (value->d).ptr[uVar7];
      switch(cVar2) {
      case L'\b':
        break;
      case L'\t':
        break;
      case L'\n':
        break;
      case L'\v':
      case L'\f':
switchD_001452bc_caseD_b:
        if ((ushort)(cVar2 + L'￠') < 0x60) {
          QString::append(QVar6);
        }
        else {
          QString::number((int)local_90,(uint)(ushort)cVar2);
          QString::rightJustified((longlong)&local_78,(QChar)(char16_t)local_90,true);
          local_60.b.d.size = local_68;
          local_60.b.d.ptr = pcStack_70;
          local_60.b.d.d = (Data *)local_78;
          local_60.a.m_size = 2;
          local_60.a.m_data = "\\u";
          local_78 = (QArrayData *)0x0;
          pcStack_70 = (char16_t *)0x0;
          local_68 = 0;
          operator+=(__return_storage_ptr__,&local_60);
          if (&(local_60.b.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_60.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_60.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                 -1;
            UNLOCK();
            if (((local_60.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                0) {
              QArrayData::deallocate(&(local_60.b.d.d)->super_QArrayData,2,0x10);
            }
          }
          if (local_78 != (QArrayData *)0x0) {
            LOCK();
            (local_78->ref_)._q_value.super___atomic_base<int>._M_i =
                 (local_78->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((local_78->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(local_78,2,0x10);
            }
          }
          if (local_90[0] != (QArrayData *)0x0) {
            LOCK();
            (local_90[0]->ref_)._q_value.super___atomic_base<int>._M_i =
                 (local_90[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((local_90[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(local_90[0],2,0x10);
            }
          }
        }
        goto LAB_00145345;
      case L'\r':
        break;
      default:
        if ((cVar2 != L'\"') && (cVar2 != L'\\')) goto switchD_001452bc_caseD_b;
      }
      QVar9.m_data = (char *)0x2;
      QVar9.m_size = (qsizetype)__return_storage_ptr__;
      QString::append(QVar9);
LAB_00145345:
      uVar7 = uVar7 + 1;
    } while ((uVar8 & 0x7fffffff) != uVar7);
  }
  QString::append(QVar6);
  pDVar3 = (__return_storage_ptr__->d).d;
  if (pDVar3 != (Data *)0x0) {
    if ((1 < (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i) ||
       ((__return_storage_ptr__->d).size < (pDVar3->super_QArrayData).alloc)) {
      QString::reallocData
                ((longlong)__return_storage_ptr__,(AllocationOption)(__return_storage_ptr__->d).size
                );
    }
    pDVar3 = (__return_storage_ptr__->d).d;
    if ((pDVar3 != (Data *)0x0) && ((pDVar3->super_QArrayData).alloc != 0)) {
      pAVar1 = &(pDVar3->super_QArrayData).flags;
      *(byte *)&(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                super_QFlagsStorage<QArrayData::ArrayOption>.i =
           (byte)(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                 super_QFlagsStorage<QArrayData::ArrayOption>.i & 0xfe;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

static QString quotedStringLiteral(const QString &value)
{
    QString result;
    const int len = value.size();
    result.reserve(int(len * 1.1) + 2);

    result += QLatin1Char('"');

    // Escape
    for (int i = 0; i < len; ++i) {
        QChar character = value.at(i);
        ushort code = character.unicode();
        switch (code) {
        case '\\':
            result += QLatin1String("\\\\");
            break;
        case '"':
            result += QLatin1String("\\\"");
            break;
        case '\b':
            result += QLatin1String("\\b");
            break;
        case '\n':
            result += QLatin1String("\\n");
            break;
        case '\r':
            result += QLatin1String("\\r");
            break;
        case '\t':
            result += QLatin1String("\\t");
            break;
        default:
            if (code >= 32 && code <= 127)
                result += character;
            else
                result += QLatin1String("\\u") + QString::number(code, 16).rightJustified(4, '0');
        }
    }

    result += QLatin1Char('"');

    result.squeeze();
    return result;
}